

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O1

void Omega_h::map_into_range<long>
               (Read<signed_char> *a_data,LO begin,LO end,Write<signed_char> *b_data,Int width)

{
  int *piVar1;
  Alloc *pAVar2;
  size_t sVar3;
  type f;
  type local_30;
  
  local_30.a_data.write_.shared_alloc_.alloc = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)local_30.a_data.write_.shared_alloc_.alloc & 1) == 0) {
    sVar3 = (local_30.a_data.write_.shared_alloc_.alloc)->size;
  }
  else {
    sVar3 = (ulong)local_30.a_data.write_.shared_alloc_.alloc >> 3;
  }
  if ((end - begin) * width == (int)(sVar3 >> 3)) {
    local_30.b_data.shared_alloc_.alloc = (b_data->shared_alloc_).alloc;
    if (((ulong)local_30.b_data.shared_alloc_.alloc & 7) == 0 &&
        local_30.b_data.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_30.b_data.shared_alloc_.alloc =
             (Alloc *)((local_30.b_data.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_30.b_data.shared_alloc_.alloc)->use_count =
             (local_30.b_data.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_30.b_data.shared_alloc_.direct_ptr = (b_data->shared_alloc_).direct_ptr;
    if (((ulong)local_30.a_data.write_.shared_alloc_.alloc & 7) == 0 &&
        local_30.a_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_30.a_data.write_.shared_alloc_.alloc =
             (Alloc *)((local_30.a_data.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_30.a_data.write_.shared_alloc_.alloc)->use_count =
             (local_30.a_data.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_30.a_data.write_.shared_alloc_.direct_ptr = (a_data->write_).shared_alloc_.direct_ptr;
    local_30.begin = begin;
    local_30.width = width;
    parallel_for<Omega_h::map_into_range<long>(Omega_h::Read<long>,int,int,Omega_h::Write<long>,int)::_lambda(int)_1_>
              (end - begin,&local_30,"map_into_range");
    pAVar2 = local_30.a_data.write_.shared_alloc_.alloc;
    if (((ulong)local_30.a_data.write_.shared_alloc_.alloc & 7) == 0 &&
        local_30.a_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_30.a_data.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_30.a_data.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_30.b_data.shared_alloc_.alloc;
    if (((ulong)local_30.b_data.shared_alloc_.alloc & 7) == 0 &&
        local_30.b_data.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_30.b_data.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_30.b_data.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    return;
  }
  fail("assertion %s failed at %s +%d\n","a_data.size() == na * width",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x32);
}

Assistant:

void map_into_range(
    Read<T> a_data, LO begin, LO end, Write<T> b_data, Int width) {
  auto na = end - begin;
  OMEGA_H_CHECK(a_data.size() == na * width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = begin + a;
    for (Int j = 0; j < width; ++j) {
      b_data[b * width + j] = a_data[a * width + j];
    }
  };
  parallel_for(na, f, "map_into_range");
}